

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O0

void __thiscall wasm::LazyLocalGraph::computeSetInfluences(LazyLocalGraph *this,LocalSet *set)

{
  bool bVar1;
  size_type sVar2;
  pointer this_00;
  LocalSet *local_18;
  LocalSet *set_local;
  LazyLocalGraph *this_local;
  
  local_18 = set;
  set_local = (LocalSet *)this;
  sVar2 = std::
          unordered_map<wasm::LocalSet_*,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>_>
          ::count(&this->setInfluences,&local_18);
  if (sVar2 != 0) {
    __assert_fail("!setInfluences.count(set)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalGraph.cpp"
                  ,0x2ac,"void wasm::LazyLocalGraph::computeSetInfluences(LocalSet *) const");
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->flower);
  if (!bVar1) {
    makeFlower(this);
  }
  this_00 = std::unique_ptr<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_>::
            operator->(&this->flower);
  LocalGraphFlower::computeSetInfluences(this_00,local_18,&this->setInfluences);
  return;
}

Assistant:

void LazyLocalGraph::computeSetInfluences(LocalSet* set) const {
  // We must never repeat work.
  assert(!setInfluences.count(set));

  if (!flower) {
    makeFlower();
  }
  flower->computeSetInfluences(set, setInfluences);
}